

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::MergeFrom(DynamicMapField *this,MapFieldBase *other)

{
  bool value;
  int iVar1;
  int iVar2;
  CppType CVar3;
  int32_t value_00;
  uint32_t value_01;
  LogMessage *other_00;
  undefined4 extraout_var;
  value_type *pvVar4;
  undefined4 extraout_var_00;
  FieldDescriptor *this_00;
  Message *pMVar5;
  Message *pMVar6;
  uint64_t value_02;
  int64_t value_03;
  string *value_04;
  float value_05;
  double value_06;
  const_iterator other_it;
  iterator iter;
  
  if (((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
       ).super_MapFieldBase.state_._M_i == STATE_MODIFIED_REPEATED) ||
     ((other->state_)._M_i == STATE_MODIFIED_REPEATED)) {
    LogMessage::LogMessage
              ((LogMessage *)&other_it,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
               ,0x165);
    other_00 = LogMessage::operator<<
                         ((LogMessage *)&other_it,
                          "CHECK failed: IsMapValid() && other.IsMapValid(): ");
    LogFinisher::operator=((LogFinisher *)&iter,other_00);
    LogMessage::~LogMessage((LogMessage *)&other_it);
  }
  iVar1 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x16])(this);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  ::iterator_base(&other_it.it_,(InnerMap *)(other + 1));
  while (other_it.it_.node_ != (Node *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    find<google::protobuf::MapKey>
              (&iter.it_,(InnerMap *)CONCAT44(extraout_var,iVar1),(MapKey *)other_it.it_.node_);
    if (iter.it_.node_ == (Node *)0x0) {
      pvVar4 = Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
               operator[]<google::protobuf::MapKey_const&>
                         ((InnerMap *)&this->map_,(MapKey *)other_it.it_.node_);
      pvVar4 = pvVar4 + 0x28;
      AllocateMapValue(this,(MapValueRef *)pvVar4);
    }
    else {
      pvVar4 = (value_type *)&(iter.it_.node_)->field_0x28;
    }
    iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
    this_00 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar2));
    CVar3 = FieldDescriptor::cpp_type(this_00);
    switch(CVar3) {
    case CPPTYPE_INT32:
      value_00 = MapValueConstRef::GetInt32Value
                           ((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetInt32Value((MapValueRef *)pvVar4,value_00);
      break;
    case CPPTYPE_INT64:
      value_03 = MapValueConstRef::GetInt64Value
                           ((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetInt64Value((MapValueRef *)pvVar4,value_03);
      break;
    case CPPTYPE_UINT32:
      value_01 = MapValueConstRef::GetUInt32Value
                           ((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetUInt32Value((MapValueRef *)pvVar4,value_01);
      break;
    case CPPTYPE_UINT64:
      value_02 = MapValueConstRef::GetUInt64Value
                           ((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetUInt64Value((MapValueRef *)pvVar4,value_02);
      break;
    case CPPTYPE_DOUBLE:
      value_06 = MapValueConstRef::GetDoubleValue
                           ((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetDoubleValue((MapValueRef *)pvVar4,value_06);
      break;
    case CPPTYPE_FLOAT:
      value_05 = MapValueConstRef::GetFloatValue
                           ((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetFloatValue((MapValueRef *)pvVar4,value_05);
      break;
    case CPPTYPE_BOOL:
      value = MapValueConstRef::GetBoolValue((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetBoolValue((MapValueRef *)pvVar4,value);
      break;
    case CPPTYPE_ENUM:
      iVar2 = MapValueConstRef::GetEnumValue((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetEnumValue((MapValueRef *)pvVar4,iVar2);
      break;
    case CPPTYPE_STRING:
      value_04 = MapValueConstRef::GetStringValue_abi_cxx11_
                           ((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      MapValueRef::SetStringValue((MapValueRef *)pvVar4,value_04);
      break;
    case CPPTYPE_MESSAGE:
      pMVar5 = MapValueRef::MutableMessageValue((MapValueRef *)pvVar4);
      pMVar6 = MapValueConstRef::GetMessageValue
                         ((MapValueConstRef *)&(other_it.it_.node_)->field_0x28);
      (*(pMVar5->super_MessageLite)._vptr_MessageLite[0xd])(pMVar5,pMVar6);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
    ::operator++(&other_it.it_);
  }
  return;
}

Assistant:

void DynamicMapField::MergeFrom(const MapFieldBase& other) {
  GOOGLE_DCHECK(IsMapValid() && other.IsMapValid());
  Map<MapKey, MapValueRef>* map = MutableMap();
  const DynamicMapField& other_field =
      reinterpret_cast<const DynamicMapField&>(other);
  for (Map<MapKey, MapValueRef>::const_iterator other_it =
           other_field.map_.begin();
       other_it != other_field.map_.end(); ++other_it) {
    Map<MapKey, MapValueRef>::iterator iter = map->find(other_it->first);
    MapValueRef* map_val;
    if (iter == map->end()) {
      map_val = &map_[other_it->first];
      AllocateMapValue(map_val);
    } else {
      map_val = &iter->second;
    }

    // Copy map value
    const FieldDescriptor* field_descriptor =
        default_entry_->GetDescriptor()->map_value();
    switch (field_descriptor->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        map_val->SetInt32Value(other_it->second.GetInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        map_val->SetInt64Value(other_it->second.GetInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        map_val->SetUInt32Value(other_it->second.GetUInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        map_val->SetUInt64Value(other_it->second.GetUInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_FLOAT: {
        map_val->SetFloatValue(other_it->second.GetFloatValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_DOUBLE: {
        map_val->SetDoubleValue(other_it->second.GetDoubleValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_BOOL: {
        map_val->SetBoolValue(other_it->second.GetBoolValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        map_val->SetStringValue(other_it->second.GetStringValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_ENUM: {
        map_val->SetEnumValue(other_it->second.GetEnumValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        map_val->MutableMessageValue()->CopyFrom(
            other_it->second.GetMessageValue());
        break;
      }
    }
  }
}